

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_parser.cpp
# Opt level: O0

bool flatbuffers::anon_unknown_0::CompareTablesByStringKey
               (Offset<flatbuffers::Table> *_a,Offset<flatbuffers::Table> *_b,FieldDef *key)

{
  voffset_t field;
  uint uVar1;
  uint uVar2;
  uint8_t *p;
  uint8_t *p_00;
  uint8_t *b;
  uint8_t *a;
  voffset_t offset;
  FieldDef *key_local;
  Offset<flatbuffers::Table> *_b_local;
  Offset<flatbuffers::Table> *_a_local;
  
  field = (key->value).offset;
  uVar1 = ReadScalar<unsigned_int>(_a);
  uVar2 = ReadScalar<unsigned_int>(_b);
  p = Table::GetAddressOf((Table *)((long)&_a->o + (ulong)uVar1),field);
  p_00 = Table::GetAddressOf((Table *)((long)&_b->o + (ulong)uVar2),field);
  if ((p == (uint8_t *)0x0) || (p_00 == (uint8_t *)0x0)) {
    _a_local._7_1_ = p != (uint8_t *)0x0;
  }
  else {
    uVar1 = ReadScalar<unsigned_int>(p);
    uVar2 = ReadScalar<unsigned_int>(p_00);
    _a_local._7_1_ = String::operator<((String *)(p + uVar1),(String *)(p_00 + uVar2));
  }
  return _a_local._7_1_;
}

Assistant:

static bool CompareTablesByStringKey(const Offset<Table> *_a,
                                     const Offset<Table> *_b,
                                     const FieldDef &key) {
  const voffset_t offset = key.value.offset;
  // Indirect offset pointer to table pointer.
  auto a = reinterpret_cast<const uint8_t *>(_a) + ReadScalar<uoffset_t>(_a);
  auto b = reinterpret_cast<const uint8_t *>(_b) + ReadScalar<uoffset_t>(_b);
  // Fetch field address from table.
  a = reinterpret_cast<const Table *>(a)->GetAddressOf(offset);
  b = reinterpret_cast<const Table *>(b)->GetAddressOf(offset);
  if (a && b) {
    // Indirect offset pointer to string pointer.
    a += ReadScalar<uoffset_t>(a);
    b += ReadScalar<uoffset_t>(b);
    return *reinterpret_cast<const String *>(a) <
           *reinterpret_cast<const String *>(b);
  } else {
    return a ? true : false;
  }
}